

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void rw::ps2::printDMAVIF(InstanceData *inst)

{
  uint8 *puVar1;
  uint qwc_00;
  uint uVar2;
  uint32 qwc;
  uint32 *base;
  uint32 *tag;
  InstanceData *inst_local;
  
  base = (uint32 *)inst->data;
  puVar1 = inst->data;
  do {
    while( true ) {
      while( true ) {
        qwc_00 = (uint)(ushort)*base;
        uVar2 = *base & 0x70000000;
        if (uVar2 != 0x10000000) break;
        printf("DMAcnt %04x %08x\n",(ulong)qwc_00,(ulong)base[1]);
        sendVIF(base[2]);
        sendVIF(base[3]);
        dmaVIF(qwc_00,base + 4);
        base = base + (qwc_00 + 1) * 4;
      }
      if (uVar2 != 0x30000000) break;
      printf("DMAref %04x %08x\n",(ulong)qwc_00,(ulong)base[1]);
      sendVIF(base[2]);
      sendVIF(base[3]);
      dmaVIF(qwc_00,(uint32 *)(puVar1 + (ulong)(base[1] << 2) * 4));
      base = base + 4;
    }
  } while (uVar2 != 0x60000000);
  printf("DMAret %04x %08x\n",(ulong)qwc_00,(ulong)base[1]);
  sendVIF(base[2]);
  sendVIF(base[3]);
  dmaVIF(qwc_00,base + 4);
  printf("\n");
  return;
}

Assistant:

void
printDMAVIF(InstanceData *inst)
{
	uint32 *tag = (uint32*)inst->data;
	uint32 *base = (uint32*)inst->data;
	uint32 qwc;

	for(;;){
		qwc = tag[0]&0xFFFF;
		switch(tag[0]&0x70000000){
		case DMAcnt:
			printf("DMAcnt %04x %08x\n", qwc, tag[1]);
			sendVIF(tag[2]);
			sendVIF(tag[3]);
			dmaVIF(qwc, tag+4);
			tag += (1+qwc)*4;
			break;

		case DMAref:
			printf("DMAref %04x %08x\n", qwc, tag[1]);
			sendVIF(tag[2]);
			sendVIF(tag[3]);
			dmaVIF(qwc, base + tag[1]*4);
			tag += 4;
			break;

		case DMAret:
			printf("DMAret %04x %08x\n", qwc, tag[1]);
			sendVIF(tag[2]);
			sendVIF(tag[3]);
			dmaVIF(qwc, tag+4);
			printf("\n");
			return;
		}
	}
}